

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::BasicAtomicCase3::RunIteration
          (BasicAtomicCase3 *this,uvec3 *param_1,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  ostream *poVar4;
  bool *compile_error;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong __n;
  vector<int,_std::allocator<int>_> idata;
  vector<unsigned_int,_std::allocator<unsigned_int>_> udata;
  allocator_type local_1d9;
  string local_1d8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"\nlayout(local_size_x = ",0x17);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", local_size_y = ",0x11);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", local_size_z = ",0x11);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,") in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_uint_out[",0x44);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"];\n  int g_int_out[",0x13);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"];\n};\nshared uint g_shared_uint[",0x20);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"];\nshared int g_shared_int[",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "];\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  atomicExchange(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[0]);\n  atomicMin(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[1]);\n  atomicMax(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[2]);\n  atomicAnd(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[3]);\n  atomicOr(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[4]);\n  atomicXor(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[5]);\n  atomicCompSwap(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]);\n\n  atomicExchange(g_shared_int[gl_LocalInvocationIndex], 3);\n  atomicMin(g_shared_int[gl_LocalInvocationIndex], 1);\n  atomicMax(g_shared_int[gl_LocalInvocationIndex], 2);\n  atomicAnd(g_shared_int[gl_LocalInvocationIndex], 0x1);\n  if (g_uint_value[1] > 0u) {\n    atomicOr(g_shared_int[gl_LocalInvocationIndex], 0x3);\n    atomicXor(g_shared_int[gl_LocalInvocationIndex], 0x1);\n    atomicCompSwap(g_shared_int[gl_LocalInvocationIndex], 0x2, 0x7);\n  }\n\n  g_uint_out[gl_LocalInvocationIndex] = g_shared_uint[gl_LocalInvocationIndex];\n  g_int_out[gl_LocalInvocationIndex] = g_shared_int[gl_LocalInvocationIndex];\n}"
             ,0x4c7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1d8);
  this->m_program = GVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar2) {
    uVar7 = param_1->m_data[1] * param_1->m_data[0] * param_1->m_data[2];
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    __n = (ulong)uVar7;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,__n * 8,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      local_1b8._0_8_ = &DAT_100000001;
      local_1b8._8_4_ = 1;
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,local_1b8,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,__n,
               (allocator_type *)&local_1d8);
    lVar6 = __n * 4;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,lVar6,(void *)local_1b8._0_8_);
    if (uVar7 != 0) {
      lVar5 = 0;
      do {
        if (*(uint *)(local_1b8._0_8_ + lVar5 * 4) != 7) {
          bVar2 = false;
          anon_unknown_0::Output
                    ("uData at index %d is %d should be %d.\n",lVar5,
                     (ulong)*(uint *)(local_1b8._0_8_ + lVar5 * 4),7);
          goto LAB_00929019;
        }
        lVar5 = lVar5 + 1;
      } while (uVar7 != (uint)lVar5);
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_1d8,__n,&local_1d9);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,lVar6,lVar6,local_1d8._M_dataplus._M_p);
    bVar2 = (int)uVar7 < 1;
    if (0 < (int)uVar7) {
      uVar1 = *(uint *)local_1d8._M_dataplus._M_p;
      lVar6 = 0;
      if (uVar1 == 7) {
        lVar6 = 0;
        do {
          if (uVar7 - 1 == (int)lVar6) {
            bVar2 = true;
            goto LAB_00929002;
          }
          uVar1 = *(uint *)(local_1d8._M_dataplus._M_p + lVar6 * 4 + 4);
          lVar6 = lVar6 + 1;
        } while (uVar1 == 7);
        bVar2 = (int)uVar7 <= (int)lVar6;
      }
      anon_unknown_0::Output("iData at index %d is %d should be %d.\n",lVar6,(ulong)uVar1,7);
    }
LAB_00929002:
    if ((uint *)local_1d8._M_dataplus._M_p != (uint *)0x0) {
      operator_delete(local_1d8._M_dataplus._M_p,
                      local_1d8.field_2._M_allocated_capacity - (long)local_1d8._M_dataplus._M_p);
    }
LAB_00929019:
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RunIteration(const uvec3& local_size, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize = local_size.x() * local_size.y() * local_size.z();

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize * 2, NULL, GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint num_groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		std::vector<GLuint> udata(kBufferSize);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, &udata[0]);
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (udata[i] != 7)
			{
				Output("uData at index %d is %d should be %d.\n", i, udata[i], 7);
				return false;
			}
		}

		std::vector<GLint> idata(kBufferSize);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize, sizeof(GLint) * kBufferSize,
						   &idata[0]);
		for (GLint i = 0; i < static_cast<GLint>(kBufferSize); ++i)
		{
			if (idata[i] != 7)
			{
				Output("iData at index %d is %d should be %d.\n", i, idata[i], 7);
				return false;
			}
		}

		return true;
	}